

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O0

bool iutest::internal::
     iuOperatorEQ<iutest::detail::iu_basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>
               (iu_basic_string_view<char,_std::char_traits<char>_> *v1,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v2)

{
  bool bVar1;
  iu_basic_string_view<char,_std::char_traits<char>_> *rhs;
  iu_basic_string_view<char,_std::char_traits<char>_> lhs;
  iu_basic_string_view<char,std::char_traits<char>> local_38 [16];
  iu_basic_string_view<char,_std::char_traits<char>_> *local_28;
  const_pointer local_20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v2_local;
  iu_basic_string_view<char,_std::char_traits<char>_> *v1_local;
  
  rhs = (iu_basic_string_view<char,_std::char_traits<char>_> *)v1->m_data;
  local_20 = (const_pointer)v1->m_size;
  local_28 = rhs;
  local_18 = v2;
  v2_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)v1;
  detail::iu_basic_string_view<char,std::char_traits<char>>::
  iu_basic_string_view<std::allocator<char>>(local_38,v2);
  lhs.m_size = (size_type)local_38;
  lhs.m_data = local_20;
  bVar1 = detail::operator==((detail *)local_28,lhs,rhs);
  return bVar1;
}

Assistant:

bool iuOperatorEQ(const T1& v1, const T2& v2)
{
IUTEST_PRAGMA_WARN_PUSH()
IUTEST_PRAGMA_WARN_DISABLE_SIGN_COMPARE()
IUTEST_PRAGMA_WARN_DISABLE_IMPLICIT_INT_FLOAT_CONVERSION()
    return v1 == v2;
IUTEST_PRAGMA_WARN_POP()
}